

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O1

string * __thiscall
sqlite::Connection::Stmt::bind_parameter_name_abi_cxx11_
          (string *__return_storage_ptr__,Stmt *this,int index)

{
  char *pcVar1;
  size_t sVar2;
  Logic_error *this_00;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  allocator local_c9;
  long *local_c8;
  long local_c0;
  long local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  string local_a8;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pcVar1 = (char *)sqlite3_bind_parameter_name(this->stmt_,index);
  if (pcVar1 != (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar2 = strlen(pcVar1);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + sVar2);
    return __return_storage_ptr__;
  }
  this_00 = (Logic_error *)__cxa_allocate_exception(0x48);
  std::__cxx11::to_string(&local_68,index);
  std::operator+(&local_48,"Error looking up bind var name for index ",&local_68);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_c8 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_c8 == plVar4) {
    local_b8 = *plVar4;
    uStack_b0 = (undefined4)plVar3[3];
    uStack_ac = *(undefined4 *)((long)plVar3 + 0x1c);
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *plVar4;
  }
  local_c0 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  sqlite3_errmsg(this->db_);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_c8);
  local_a8._M_dataplus._M_p = (pointer)*plVar3;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_a8._M_dataplus._M_p == psVar5) {
    local_a8.field_2._M_allocated_capacity = *psVar5;
    local_a8.field_2._8_4_ = (undefined4)plVar3[3];
    local_a8.field_2._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  }
  else {
    local_a8.field_2._M_allocated_capacity = *psVar5;
  }
  local_a8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  pcVar1 = (char *)sqlite3_sql(this->stmt_);
  std::__cxx11::string::string((string *)&local_88,pcVar1,&local_c9);
  Logic_error::Logic_error(this_00,&local_a8,&local_88,1,this->db_);
  __cxa_throw(this_00,&Logic_error::typeinfo,Logic_error::~Logic_error);
}

Assistant:

std::string Connection::Stmt::bind_parameter_name(const int index)
    {
        const char * name = sqlite3_bind_parameter_name(stmt_, index);
        if(!name)
        {
            throw Logic_error("Error looking up bind var name for index " +
                std::to_string(index) + ": " + sqlite3_errmsg(db_), sqlite3_sql(stmt_), SQLITE_ERROR, db_);
        }
        return std::string(name);
    }